

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test3.cpp
# Opt level: O0

void __thiscall
Json_for_modern_parse__Test::~Json_for_modern_parse__Test(Json_for_modern_parse__Test *this)

{
  Json_for_modern_parse__Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(Json_for_modern, parse_){
nlohmann::json outputJson;
    auto j3 = json::parse("[\n"
                          "    [\"Si-9.15\", \"RTS-9.15\", \"GAZP-9.15\"],\n"
                          "    [100024, 100027, 100050],\n"
                          "    [\"Futures contract for USD/RUB\", "
                          "\"Futures contract for index RTS\", "
                          "\"Futures contract for Gazprom shares\"]\n"
                          "]");
    uint64_t tmp;

    for (uint64_t i = 0; i < j3[0].size(); ++i) {
        tmp = 0;
        while (tmp < j3.size()) {
            outputJson.push_back(
                    nlohmann::json
                            {
                                    {"ticker",      j3[tmp++][i]},
                                    {"id",          j3[tmp++][i]},
                                    {"description", j3[tmp++][i]},
                            });
        }
    }
    std::cout << outputJson;
}